

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int fmt::v8::detail::parse_nonnegative_int<char8_t>(char8_t **begin,char8_t *end,int error_value)

{
  char8_t *pcVar1;
  bool bVar2;
  byte *pbVar3;
  uint local_4c;
  uint max;
  long num_digits;
  char8_t *p;
  uint local_28;
  uint prev;
  uint value;
  int error_value_local;
  char8_t *end_local;
  char8_t **begin_local;
  
  if (((*begin == end) || ((byte)**begin < 0x30)) || (0x39 < (byte)**begin)) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x8ca,"");
  }
  local_28 = 0;
  pbVar3 = (byte *)*begin;
  begin_local._4_4_ = local_28;
  do {
    local_28 = begin_local._4_4_;
    num_digits = (long)pbVar3;
    begin_local._4_4_ = local_28 * 10 + (*(byte *)num_digits - 0x30);
    pbVar3 = (byte *)(num_digits + 1);
    bVar2 = false;
    if ((pbVar3 != (byte *)end) && (bVar2 = false, 0x2f < *pbVar3)) {
      bVar2 = *pbVar3 < 0x3a;
    }
  } while (bVar2);
  pcVar1 = *begin;
  *begin = (char8_t *)pbVar3;
  if (9 < (long)pbVar3 - (long)pcVar1) {
    local_4c = error_value;
    if (((long)pbVar3 - (long)pcVar1 == 10) &&
       ((ulong)local_28 * 10 + (ulong)(*(byte *)num_digits - 0x30) < 0x80000000)) {
      local_4c = begin_local._4_4_;
    }
    begin_local._4_4_ = local_4c;
  }
  return begin_local._4_4_;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}